

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_spin_flip.hpp
# Opt level: O3

void openjij::updater::
     SingleSpinFlip<openjij::system::ClassicalIsing<openjij::graph::Dense<double>>>::
     update<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (ClIsing *system,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *random_number_engine,ClassicalUpdaterParameter *parameter)

{
  double *pdVar1;
  ulong uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  double dVar7;
  double dVar8;
  int iVar9;
  ulong uVar10;
  Index index;
  ulong uVar11;
  long lVar12;
  long lVar13;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  double dVar14;
  double dVar15;
  
  Eigen::internal::manage_multi_threading(Eigen::Action,int*)::m_maxThreads = 1;
  if (Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes == '\0')
  {
    iVar9 = __cxa_guard_acquire(&Eigen::internal::
                                 manage_caching_sizes(Eigen::Action,long*,long*,long*)::m_cacheSizes
                               );
    if (iVar9 != 0) {
      Eigen::internal::CacheSizes::CacheSizes
                ((CacheSizes *)
                 &Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                  m_cacheSizes);
      __cxa_guard_release(&Eigen::internal::manage_caching_sizes(Eigen::Action,long*,long*,long*)::
                           m_cacheSizes);
    }
  }
  if (system->num_spins != 0) {
    lVar13 = 0;
    uVar10 = 0;
    do {
      if ((system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)uVar10) goto LAB_00175970;
      dVar14 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data[uVar10];
      if (dVar14 <= 0.0) {
LAB_00175834:
        uVar2 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_rows;
        if ((long)uVar2 <= (long)uVar10) goto LAB_00175970;
        pdVar3 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar4 = (system->interaction).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data;
        dVar14 = pdVar3[uVar10] * 4.0;
        uVar5 = (system->interaction).
                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_cols;
        if ((long)uVar5 < 0 && pdVar4 != (double *)0x0) {
          __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                        ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                        "Eigen::MapBase<Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>, Level = 0]"
                       );
        }
        if ((system->interaction).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
            m_storage.m_rows <= (long)uVar10) {
          __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                        "Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>::Block(XprType &, Index) [XprType = const Eigen::Matrix<double, -1, -1, 1>, BlockRows = 1, BlockCols = -1, InnerPanel = true]"
                       );
        }
        if (uVar5 != uVar2) {
          __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                        "Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, const Eigen::Matrix<double, -1, 1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_product_op<double>, Lhs = const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, Rhs = const Eigen::Matrix<double, -1, 1>]"
                       );
        }
        if ((system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
            m_rows != uVar2) {
          __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                        "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2f2,
                        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Matrix<double, -1, 1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::Transpose<const Eigen::Block<const Eigen::Matrix<double, -1, -1, 1>, 1, -1, true>>, const Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::add_assign_op<double, double>]"
                       );
        }
        pdVar6 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        uVar11 = uVar2 & 0xfffffffffffffffe;
        if (1 < uVar2) {
          lVar12 = 0;
          do {
            pdVar1 = (double *)((long)pdVar4 + lVar12 * 8 + uVar5 * lVar13);
            dVar7 = pdVar1[1];
            dVar8 = (pdVar3 + lVar12)[1];
            dVar15 = (pdVar6 + lVar12)[1];
            pdVar6[lVar12] = pdVar3[lVar12] * *pdVar1 * dVar14 + pdVar6[lVar12];
            (pdVar6 + lVar12)[1] = dVar8 * dVar7 * dVar14 + dVar15;
            lVar12 = lVar12 + 2;
          } while (lVar12 < (long)uVar11);
        }
        if (uVar11 != uVar2) {
          do {
            pdVar6[uVar11] =
                 *(double *)((long)pdVar4 + uVar11 * 8 + uVar5 * lVar13) * pdVar3[uVar11] * dVar14 +
                 pdVar6[uVar11];
            uVar11 = uVar11 + 1;
          } while (uVar2 != uVar11);
        }
        if (((system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_rows <= (long)uVar10) ||
           (pdVar3 = (system->dE).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                     m_storage.m_data, pdVar3[uVar10] = -pdVar3[uVar10],
           (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_rows <= (long)uVar10)) goto LAB_00175970;
        pdVar3 = (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                 m_storage.m_data;
        pdVar3[uVar10] = -pdVar3[uVar10];
      }
      else {
        dVar14 = exp(dVar14 * -parameter->beta);
        dVar15 = std::
                 generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                           (random_number_engine);
        if (dVar15 < dVar14) goto LAB_00175834;
      }
      uVar2 = system->num_spins;
      if (((long)uVar2 < 0) ||
         ((system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows <= (long)uVar2)) {
LAB_00175970:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      (system->spin).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar2] = 1.0;
      uVar10 = uVar10 + 1;
      lVar13 = lVar13 + 8;
    } while (uVar10 < uVar2);
  }
  return;
}

Assistant:

inline static void
  update(ClIsing &system, RandomNumberEngine &random_number_engine,
         const utility::ClassicalUpdaterParameter &parameter) {
    // set probability distribution object
    // to do Metroopolis
    auto urd = std::uniform_real_distribution<>(0, 1.0);

    Eigen::setNbThreads(1);
    Eigen::initParallel();

    // do a iteraction except for the auxiliary spin
    for (std::size_t index = 0; index < system.num_spins; ++index) {

      if (system.dE(index) <= 0 ||
          std::exp(-parameter.beta * system.dE(index)) >
              urd(random_number_engine)) {
        // update dE
        system.dE += 4 * system.spin(index) *
                     (system.interaction.row(index).transpose().cwiseProduct(
                         system.spin));

        system.dE(index) *= -1;
        system.spin(index) *= -1;
      }

      // assure that the dummy spin is not changed.
      system.spin(system.num_spins) = 1;
    }
  }